

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

xmlAttributePtr
xmlAddAttributeDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *elem,xmlChar *name,xmlChar *ns,
                   xmlAttributeType type,xmlAttributeDefault def,xmlChar *defaultValue,
                   xmlEnumerationPtr tree)

{
  xmlDocPtr doc;
  _xmlDoc *p_Var1;
  _xmlNode *p_Var2;
  xmlChar *key2;
  xmlAttributePtr pxVar3;
  int iVar4;
  xmlHashTablePtr pxVar5;
  xmlAttributePtr attr;
  xmlChar *pxVar6;
  void *pvVar7;
  xmlElementPtr elem_00;
  xmlChar *pxVar8;
  xmlAttributePtr pxVar9;
  xmlAttributePtr *ppxVar10;
  _xmlDict *dict;
  undefined4 in_register_0000008c;
  xmlChar *name_00;
  xmlDictPtr local_60;
  xmlChar *local_58;
  xmlChar *local_50;
  xmlChar *local_48;
  undefined8 local_40;
  xmlHashTablePtr local_38;
  
  if (((dtd == (xmlDtdPtr)0x0) || (name == (xmlChar *)0x0)) || (elem == (xmlChar *)0x0))
  goto LAB_001541c7;
  doc = dtd->doc;
  if (doc == (xmlDocPtr)0x0) {
    local_60 = (xmlDictPtr)0x0;
  }
  else {
    local_60 = doc->dict;
  }
  if (9 < type - XML_ATTRIBUTE_CDATA) {
    xmlErrValid(ctxt,XML_ERR_ARGUMENT,"xmlAddAttributeDecl: invalid type\n",(char *)0x0);
    xmlFreeEnumeration(tree);
    return (xmlAttributePtr)0x0;
  }
  local_40 = CONCAT44(in_register_0000008c,type);
  if (defaultValue == (xmlChar *)0x0) {
LAB_00154098:
    defaultValue = (xmlChar *)0x0;
  }
  else {
    iVar4 = xmlValidateAttributeValueInternal(doc,type,defaultValue);
    if (iVar4 == 0) {
      xmlErrValidNode(ctxt,(xmlNodePtr)dtd,XML_DTD_ATTRIBUTE_DEFAULT,
                      "Attribute %s of %s: invalid default value\n",elem,name,defaultValue);
      if (ctxt != (xmlValidCtxtPtr)0x0) {
        ctxt->valid = 0;
      }
      goto LAB_00154098;
    }
  }
  p_Var1 = dtd->doc;
  if (((p_Var1 != (_xmlDoc *)0x0) && (p_Var1->extSubset == dtd)) &&
     ((p_Var1->intSubset != (_xmlDtd *)0x0 &&
      ((pxVar5 = (xmlHashTablePtr)p_Var1->intSubset->attributes, pxVar5 != (xmlHashTablePtr)0x0 &&
       (pvVar7 = xmlHashLookup3(pxVar5,name,ns,elem), pvVar7 != (void *)0x0)))))) {
LAB_001541c7:
    xmlFreeEnumeration(tree);
    return (xmlAttributePtr)0x0;
  }
  pxVar5 = (xmlHashTablePtr)dtd->attributes;
  local_50 = defaultValue;
  if (pxVar5 == (xmlHashTablePtr)0x0) {
    attr = (xmlAttributePtr)0x0;
    pxVar5 = xmlHashCreateDict(0,local_60);
    dtd->attributes = pxVar5;
    if (pxVar5 != (xmlHashTablePtr)0x0) goto LAB_001540d6;
  }
  else {
LAB_001540d6:
    local_38 = pxVar5;
    attr = (xmlAttributePtr)(*xmlMalloc)(0x78);
    if (attr == (xmlAttributePtr)0x0) {
      attr = (xmlAttributePtr)0x0;
    }
    else {
      attr->_private = (void *)0x0;
      *(undefined8 *)&attr->type = 0;
      attr->atype = 0;
      attr->def = 0;
      attr->defaultValue = (xmlChar *)0x0;
      attr->tree = (xmlEnumerationPtr)0x0;
      attr->prefix = (xmlChar *)0x0;
      attr->doc = (_xmlDoc *)0x0;
      attr->nexth = (_xmlAttribute *)0x0;
      attr->next = (_xmlNode *)0x0;
      attr->prev = (_xmlNode *)0x0;
      attr->last = (_xmlNode *)0x0;
      attr->parent = (_xmlDtd *)0x0;
      attr->name = (xmlChar *)0x0;
      attr->children = (_xmlNode *)0x0;
      attr->elem = (xmlChar *)0x0;
      attr->type = XML_ATTRIBUTE_DECL;
      attr->atype = (xmlAttributeType)local_40;
      attr->doc = dtd->doc;
      local_48 = elem;
      if (local_60 == (xmlDictPtr)0x0) {
        pxVar6 = xmlStrdup(name);
        name_00 = local_48;
        attr->name = pxVar6;
        pxVar6 = xmlStrdup(local_48);
      }
      else {
        pxVar6 = xmlDictLookup(local_60,name,-1);
        name_00 = local_48;
        attr->name = pxVar6;
        pxVar6 = xmlDictLookup(local_60,local_48,-1);
      }
      attr->elem = pxVar6;
      if ((attr->name != (xmlChar *)0x0) && (pxVar6 != (xmlChar *)0x0)) {
        if (ns != (xmlChar *)0x0) {
          if (local_60 == (xmlDictPtr)0x0) {
            pxVar6 = xmlStrdup(ns);
          }
          else {
            pxVar6 = xmlDictLookup(local_60,ns,-1);
          }
          attr->prefix = pxVar6;
          if (pxVar6 == (xmlChar *)0x0) goto LAB_0015448a;
        }
        attr->def = def;
        attr->tree = tree;
        if (local_50 == (xmlChar *)0x0) {
LAB_0015429a:
          local_58 = (xmlChar *)0x0;
          pxVar5 = (xmlHashTablePtr)dtd->elements;
          if (pxVar5 == (xmlHashTablePtr)0x0) {
            if (dtd->doc == (_xmlDoc *)0x0) {
              dict = (xmlDictPtr)0x0;
            }
            else {
              dict = dtd->doc->dict;
            }
            elem_00 = (xmlElementPtr)0x0;
            pxVar5 = xmlHashCreateDict(0,dict);
            dtd->elements = pxVar5;
            if (pxVar5 != (xmlHashTablePtr)0x0) goto LAB_001542d6;
            goto LAB_00154461;
          }
LAB_001542d6:
          pxVar6 = xmlSplitQName4(name_00,&local_58);
          if (pxVar6 == (xmlChar *)0x0) {
LAB_0015445f:
            elem_00 = (xmlElementPtr)0x0;
          }
          else {
            elem_00 = (xmlElementPtr)xmlHashLookup2(pxVar5,pxVar6,local_58);
            if (elem_00 != (xmlElementPtr)0x0) {
LAB_0015430d:
              if (local_58 != (xmlChar *)0x0) {
                (*xmlFree)(local_58);
              }
              iVar4 = xmlHashAdd3(local_38,attr->name,attr->prefix,attr->elem,attr);
              if (0 < iVar4) {
                if ((((int)local_40 == 2) &&
                    (iVar4 = xmlScanIDAttributeDecl(ctxt,elem_00,1), iVar4 != 0)) &&
                   (xmlErrValidNode(ctxt,(xmlNodePtr)dtd,XML_DTD_MULTIPLE_ID,
                                    "Element %s has too may ID attributes defined : %s\n",name_00,
                                    name,(xmlChar *)0x0), ctxt != (xmlValidCtxtPtr)0x0)) {
                  ctxt->valid = 0;
                }
                iVar4 = xmlStrEqual(attr->name,"xmlns");
                if ((iVar4 == 0) &&
                   ((attr->prefix == (xmlChar *)0x0 ||
                    (iVar4 = xmlStrEqual(attr->prefix,"xmlns"), iVar4 == 0)))) {
                  ppxVar10 = &elem_00->attributes;
                  pxVar3 = elem_00->attributes;
                  do {
                    pxVar9 = pxVar3;
                    if (pxVar9 == (xmlAttributePtr)0x0) goto LAB_001543ad;
                    iVar4 = xmlStrEqual(pxVar9->name,"xmlns");
                  } while (((iVar4 != 0) ||
                           ((attr->prefix != (xmlChar *)0x0 &&
                            (iVar4 = xmlStrEqual(attr->prefix,"xmlns"), iVar4 != 0)))) &&
                          (pxVar3 = pxVar9->nexth, pxVar9->nexth != (_xmlAttribute *)0x0));
                  ppxVar10 = &pxVar9->nexth;
                }
                else {
                  ppxVar10 = &elem_00->attributes;
                }
LAB_001543ad:
                attr->nexth = *ppxVar10;
                *ppxVar10 = attr;
                attr->parent = dtd;
                p_Var2 = dtd->last;
                if (p_Var2 == (_xmlNode *)0x0) {
                  dtd->last = (_xmlNode *)attr;
                  dtd->children = (_xmlNode *)attr;
                  return attr;
                }
                p_Var2->next = (_xmlNode *)attr;
                attr->prev = p_Var2;
                dtd->last = (_xmlNode *)attr;
                return attr;
              }
              if (-1 < iVar4) {
                xmlErrValidWarning(ctxt,(xmlNodePtr)dtd,XML_DTD_ATTRIBUTE_REDEFINED,
                                   "Attribute %s of element %s: already defined\n",name,name_00,
                                   (xmlChar *)0x0);
                goto LAB_00154497;
              }
              tree = (xmlEnumerationPtr)0x0;
              goto LAB_0015448a;
            }
            elem_00 = (xmlElementPtr)(*xmlMalloc)(0x70);
            if (elem_00 == (xmlElementPtr)0x0) goto LAB_0015445f;
            elem_00->_private = (void *)0x0;
            *(undefined8 *)&elem_00->type = 0;
            elem_00->prefix = (xmlChar *)0x0;
            elem_00->contModel = (xmlRegexpPtr)0x0;
            elem_00->content = (xmlElementContentPtr)0x0;
            elem_00->attributes = (xmlAttributePtr)0x0;
            elem_00->doc = (_xmlDoc *)0x0;
            *(undefined8 *)&elem_00->etype = 0;
            elem_00->next = (_xmlNode *)0x0;
            elem_00->prev = (_xmlNode *)0x0;
            elem_00->last = (_xmlNode *)0x0;
            elem_00->parent = (_xmlDtd *)0x0;
            elem_00->name = (xmlChar *)0x0;
            elem_00->children = (_xmlNode *)0x0;
            elem_00->type = XML_ELEMENT_DECL;
            elem_00->doc = dtd->doc;
            pxVar8 = xmlStrdup(pxVar6);
            key2 = local_58;
            elem_00->name = pxVar8;
            if (pxVar8 != (xmlChar *)0x0) {
              elem_00->prefix = local_58;
              local_58 = (xmlChar *)0x0;
              elem_00->etype = XML_ELEMENT_TYPE_UNDEFINED;
              iVar4 = xmlHashAdd2(pxVar5,pxVar6,key2,elem_00);
              if (0 < iVar4) goto LAB_0015430d;
            }
          }
LAB_00154461:
          xmlVErrMemory(ctxt);
          (*xmlFree)(local_58);
          xmlFreeElement(elem_00);
        }
        else {
          if (local_60 == (xmlDictPtr)0x0) {
            pxVar6 = xmlStrdup(local_50);
          }
          else {
            pxVar6 = xmlDictLookup(local_60,local_50,-1);
          }
          attr->defaultValue = pxVar6;
          if (pxVar6 != (xmlChar *)0x0) goto LAB_0015429a;
        }
        tree = (xmlEnumerationPtr)0x0;
      }
    }
  }
LAB_0015448a:
  xmlVErrMemory(ctxt);
  xmlFreeEnumeration(tree);
LAB_00154497:
  xmlFreeAttribute(attr);
  return (xmlAttributePtr)0x0;
}

Assistant:

xmlAttributePtr
xmlAddAttributeDecl(xmlValidCtxtPtr ctxt,
                    xmlDtdPtr dtd, const xmlChar *elem,
                    const xmlChar *name, const xmlChar *ns,
		    xmlAttributeType type, xmlAttributeDefault def,
		    const xmlChar *defaultValue, xmlEnumerationPtr tree) {
    xmlAttributePtr ret = NULL;
    xmlAttributeTablePtr table;
    xmlElementPtr elemDef;
    xmlDictPtr dict = NULL;
    int res;

    if (dtd == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (name == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (elem == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (dtd->doc != NULL)
	dict = dtd->doc->dict;

#ifdef LIBXML_VALID_ENABLED
    /*
     * Check the type and possibly the default value.
     */
    switch (type) {
        case XML_ATTRIBUTE_CDATA:
	    break;
        case XML_ATTRIBUTE_ID:
	    break;
        case XML_ATTRIBUTE_IDREF:
	    break;
        case XML_ATTRIBUTE_IDREFS:
	    break;
        case XML_ATTRIBUTE_ENTITY:
	    break;
        case XML_ATTRIBUTE_ENTITIES:
	    break;
        case XML_ATTRIBUTE_NMTOKEN:
	    break;
        case XML_ATTRIBUTE_NMTOKENS:
	    break;
        case XML_ATTRIBUTE_ENUMERATION:
	    break;
        case XML_ATTRIBUTE_NOTATION:
	    break;
	default:
	    xmlErrValid(ctxt, XML_ERR_ARGUMENT,
		    "xmlAddAttributeDecl: invalid type\n", NULL);
	    xmlFreeEnumeration(tree);
	    return(NULL);
    }
    if ((defaultValue != NULL) &&
        (!xmlValidateAttributeValueInternal(dtd->doc, type, defaultValue))) {
	xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_ATTRIBUTE_DEFAULT,
	                "Attribute %s of %s: invalid default value\n",
	                elem, name, defaultValue);
	defaultValue = NULL;
	if (ctxt != NULL)
	    ctxt->valid = 0;
    }
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check first that an attribute defined in the external subset wasn't
     * already defined in the internal subset
     */
    if ((dtd->doc != NULL) && (dtd->doc->extSubset == dtd) &&
	(dtd->doc->intSubset != NULL) &&
	(dtd->doc->intSubset->attributes != NULL)) {
        ret = xmlHashLookup3(dtd->doc->intSubset->attributes, name, ns, elem);
	if (ret != NULL) {
	    xmlFreeEnumeration(tree);
	    return(NULL);
	}
    }

    /*
     * Create the Attribute table if needed.
     */
    table = (xmlAttributeTablePtr) dtd->attributes;
    if (table == NULL) {
        table = xmlHashCreateDict(0, dict);
	dtd->attributes = (void *) table;
    }
    if (table == NULL)
        goto mem_error;

    ret = (xmlAttributePtr) xmlMalloc(sizeof(xmlAttribute));
    if (ret == NULL)
        goto mem_error;
    memset(ret, 0, sizeof(xmlAttribute));
    ret->type = XML_ATTRIBUTE_DECL;

    /*
     * fill the structure.
     */
    ret->atype = type;
    /*
     * doc must be set before possible error causes call
     * to xmlFreeAttribute (because it's used to check on
     * dict use)
     */
    ret->doc = dtd->doc;
    if (dict) {
	ret->name = xmlDictLookup(dict, name, -1);
	ret->elem = xmlDictLookup(dict, elem, -1);
    } else {
	ret->name = xmlStrdup(name);
	ret->elem = xmlStrdup(elem);
    }
    if ((ret->name == NULL) || (ret->elem == NULL))
        goto mem_error;
    if (ns != NULL) {
        if (dict)
            ret->prefix = xmlDictLookup(dict, ns, -1);
        else
            ret->prefix = xmlStrdup(ns);
        if (ret->prefix == NULL)
            goto mem_error;
    }
    ret->def = def;
    ret->tree = tree;
    tree = NULL;
    if (defaultValue != NULL) {
        if (dict)
	    ret->defaultValue = xmlDictLookup(dict, defaultValue, -1);
	else
	    ret->defaultValue = xmlStrdup(defaultValue);
        if (ret->defaultValue == NULL)
            goto mem_error;
    }

    elemDef = xmlGetDtdElementDesc2(ctxt, dtd, elem);
    if (elemDef == NULL)
        goto mem_error;

    /*
     * Validity Check:
     * Search the DTD for previous declarations of the ATTLIST
     */
    res = xmlHashAdd3(table, ret->name, ret->prefix, ret->elem, ret);
    if (res <= 0) {
        if (res < 0)
            goto mem_error;
#ifdef LIBXML_VALID_ENABLED
        /*
         * The attribute is already defined in this DTD.
         */
        xmlErrValidWarning(ctxt, (xmlNodePtr) dtd,
                XML_DTD_ATTRIBUTE_REDEFINED,
                "Attribute %s of element %s: already defined\n",
                name, elem, NULL);
#endif /* LIBXML_VALID_ENABLED */
	xmlFreeAttribute(ret);
	return(NULL);
    }

    /*
     * Validity Check:
     * Multiple ID per element
     */
#ifdef LIBXML_VALID_ENABLED
    if ((type == XML_ATTRIBUTE_ID) &&
        (xmlScanIDAttributeDecl(ctxt, elemDef, 1) != 0)) {
        xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_MULTIPLE_ID,
       "Element %s has too may ID attributes defined : %s\n",
               elem, name, NULL);
        if (ctxt != NULL)
            ctxt->valid = 0;
    }
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Insert namespace default def first they need to be
     * processed first.
     */
    if ((xmlStrEqual(ret->name, BAD_CAST "xmlns")) ||
        ((ret->prefix != NULL &&
         (xmlStrEqual(ret->prefix, BAD_CAST "xmlns"))))) {
        ret->nexth = elemDef->attributes;
        elemDef->attributes = ret;
    } else {
        xmlAttributePtr tmp = elemDef->attributes;

        while ((tmp != NULL) &&
               ((xmlStrEqual(tmp->name, BAD_CAST "xmlns")) ||
                ((ret->prefix != NULL &&
                 (xmlStrEqual(ret->prefix, BAD_CAST "xmlns")))))) {
            if (tmp->nexth == NULL)
                break;
            tmp = tmp->nexth;
        }
        if (tmp != NULL) {
            ret->nexth = tmp->nexth;
            tmp->nexth = ret;
        } else {
            ret->nexth = elemDef->attributes;
            elemDef->attributes = ret;
        }
    }

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
        dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }
    return(ret);

mem_error:
    xmlVErrMemory(ctxt);
    xmlFreeEnumeration(tree);
    xmlFreeAttribute(ret);
    return(NULL);
}